

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

double __thiscall AmpIO::GetEncoderClockPeriod(AmpIO *this)

{
  uint32_t uVar1;
  double dVar2;
  
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar1 < 6) {
    dVar2 = 1.3020833333333333e-06;
  }
  else if (uVar1 == 6) {
    dVar2 = 3.255208333333333e-07;
  }
  else {
    uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
    dVar2 = *(double *)(&DAT_00119718 + (ulong)(uVar1 == 0x64524131) * 8);
  }
  return dVar2;
}

Assistant:

double AmpIO::GetEncoderClockPeriod(void) const
{
    // Could instead return encVelData[0].clkPeriod
    uint32_t fver = GetFirmwareVersion();
    if (fver < 6)
        return VEL_PERD_OLD;
    else if (fver == 6)
        return VEL_PERD_REV6;
    return (GetHardwareVersion() == dRA1_String) ? VEL_PERD_ESPM : VEL_PERD;
}